

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O3

void __thiscall
TextFile::writeFormat<unsigned_long,char_const*>
          (TextFile *this,char *text,unsigned_long *args,char **args_1)

{
  void *__buf;
  char **in_R8;
  string message;
  string local_30;
  
  tinyformat::format<unsigned_long,char_const*>
            (&local_30,(tinyformat *)text,(char *)args,(unsigned_long *)args_1,in_R8);
  write(this,(int)&local_30,__buf,(size_t)args_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void writeFormat(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		write(message);
	}